

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

void tsd_prng_state_init(tsd_t *tsd)

{
  tsd_t *tsd_local;
  uint8_t state;
  
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = (uint64_t)tsd;
  return;
}

Assistant:

static void
tsd_prng_state_init(tsd_t *tsd) {
	/*
	 * A nondeterministic seed based on the address of tsd reduces
	 * the likelihood of lockstep non-uniform cache index
	 * utilization among identical concurrent processes, but at the
	 * cost of test repeatability.  For debug builds, instead use a
	 * deterministic seed.
	 */
	*tsd_prng_statep_get(tsd) = config_debug ? 0 :
	    (uint64_t)(uintptr_t)tsd;
}